

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_BMP_Image.cxx
# Opt level: O0

void __thiscall Fl_BMP_Image::Fl_BMP_Image(Fl_BMP_Image *this,char *bmp)

{
  undefined8 uVar1;
  unsigned_short uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  FILE *__stream;
  size_t sVar10;
  uchar *puVar11;
  undefined1 *puVar12;
  bool bVar13;
  bool bVar14;
  uchar a;
  uchar b;
  int maskSize;
  int Bpp;
  int use_5_6_5;
  undefined1 local_374;
  undefined1 local_373;
  uchar havemask;
  uchar colormap [256] [3];
  uchar *ptr;
  uchar byte;
  uchar bit;
  long offbits;
  int local_58;
  int end_y;
  int start_y;
  int row_order;
  int dataSize;
  int align;
  int temp;
  int repcount;
  int color;
  int y;
  int x;
  int colors_used;
  int compression;
  int bDepth;
  int depth;
  int info_size;
  FILE *fp;
  char *bmp_local;
  Fl_BMP_Image *this_local;
  
  Fl_RGB_Image::Fl_RGB_Image(&this->super_Fl_RGB_Image,(uchar *)0x0,0,0,3,0);
  (this->super_Fl_RGB_Image).super_Fl_Image._vptr_Fl_Image =
       (_func_int **)&PTR__Fl_BMP_Image_002efa10;
  colors_used = 3;
  __stream = (FILE *)fl_fopen(bmp,"rb");
  if (__stream == (FILE *)0x0) {
    Fl_Image::ld((Fl_Image *)this,-2);
  }
  else {
    iVar3 = getc(__stream);
    iVar4 = getc(__stream);
    if (((char)iVar3 == 'B') && ((char)iVar4 == 'M')) {
      read_dword((FILE *)__stream);
      read_word((FILE *)__stream);
      read_word((FILE *)__stream);
      uVar5 = read_dword((FILE *)__stream);
      uVar6 = read_dword((FILE *)__stream);
      bVar13 = false;
      end_y = -1;
      bVar14 = false;
      if ((int)uVar6 < 0x28) {
        uVar2 = read_word((FILE *)__stream);
        Fl_Image::w((Fl_Image *)this,(uint)uVar2);
        uVar2 = read_word((FILE *)__stream);
        Fl_Image::h((Fl_Image *)this,(uint)uVar2);
        read_word((FILE *)__stream);
        uVar2 = read_word((FILE *)__stream);
        compression = (int)uVar2;
        x = 0;
        y = 0;
        align = uVar6 - 0xc;
      }
      else {
        iVar3 = read_long((FILE *)__stream);
        Fl_Image::w((Fl_Image *)this,iVar3);
        iVar3 = read_long((FILE *)__stream);
        if (iVar3 < 0) {
          end_y = 1;
        }
        if (iVar3 < 1) {
          iVar3 = -iVar3;
        }
        Fl_Image::h((Fl_Image *)this,iVar3);
        read_word((FILE *)__stream);
        uVar2 = read_word((FILE *)__stream);
        compression = (int)uVar2;
        x = read_dword((FILE *)__stream);
        uVar7 = read_dword((FILE *)__stream);
        read_long((FILE *)__stream);
        read_long((FILE *)__stream);
        y = read_dword((FILE *)__stream);
        read_dword((FILE *)__stream);
        align = uVar6 - 0x28;
        if (((x == 0) && (7 < (uint)compression)) &&
           (iVar3 = Fl_Image::w((Fl_Image *)this), (int)(0x20 / (ulong)(long)compression) < iVar3))
        {
          iVar4 = Fl_Image::w((Fl_Image *)this);
          iVar9 = Fl_Image::h((Fl_Image *)this);
          iVar8 = Fl_Image::w((Fl_Image *)this);
          iVar3 = iVar8 + 7;
          if (iVar8 + 7 < 0) {
            iVar3 = iVar8 + 0xe;
          }
          iVar8 = Fl_Image::h((Fl_Image *)this);
          bVar13 = (iVar4 * (compression >> 3) + 3U & 0xfffffffc) * iVar9 +
                   ((iVar3 >> 3) + 3U & 0xfffffffc) * iVar8 == uVar7 * 2;
          if (bVar13) {
            iVar3 = Fl_Image::h((Fl_Image *)this);
            Fl_Image::h((Fl_Image *)this,iVar3 / 2);
            colors_used = 4;
          }
        }
      }
      for (; 0 < align; align = align + -1) {
        getc(__stream);
      }
      iVar3 = Fl_Image::w((Fl_Image *)this);
      if (((iVar3 == 0) || (iVar3 = Fl_Image::h((Fl_Image *)this), iVar3 == 0)) ||
         (compression == 0)) {
        fclose(__stream);
        Fl_Image::w((Fl_Image *)this,0);
        Fl_Image::h((Fl_Image *)this,0);
        Fl_Image::d((Fl_Image *)this,0);
        Fl_Image::ld((Fl_Image *)this,-3);
      }
      else {
        if ((y == 0) && ((uint)compression < 9)) {
          y = 1 << ((byte)compression & 0x1f);
        }
        for (align = 0; align < y; align = align + 1) {
          fread((void *)((long)&use_5_6_5 + (long)align * 3),1,3,__stream);
          if (0xc < (int)uVar6) {
            getc(__stream);
          }
        }
        if (compression == 0x10) {
          uVar6 = read_dword((FILE *)__stream);
          bVar14 = uVar6 == 0xf800;
        }
        if (compression == 0x20) {
          colors_used = 4;
        }
        Fl_Image::d((Fl_Image *)this,colors_used);
        if ((ulong)uVar5 != 0) {
          fseek(__stream,(ulong)uVar5,0);
        }
        iVar3 = Fl_Image::w((Fl_Image *)this);
        iVar4 = Fl_Image::h((Fl_Image *)this);
        iVar9 = Fl_Image::d((Fl_Image *)this);
        sVar10 = Fl_RGB_Image::max_size();
        if (sVar10 < (ulong)((long)iVar3 * (long)iVar4 * (long)iVar9)) {
          (*Fl::warning)("BMP file \"%s\" is too large!\n");
          fclose(__stream);
          Fl_Image::w((Fl_Image *)this,0);
          Fl_Image::h((Fl_Image *)this,0);
          Fl_Image::d((Fl_Image *)this,0);
          Fl_Image::ld((Fl_Image *)this,-3);
        }
        else {
          iVar3 = Fl_Image::w((Fl_Image *)this);
          iVar4 = Fl_Image::h((Fl_Image *)this);
          iVar9 = Fl_Image::d((Fl_Image *)this);
          puVar11 = (uchar *)operator_new__((long)(iVar3 * iVar4 * iVar9));
          (this->super_Fl_RGB_Image).array = puVar11;
          (this->super_Fl_RGB_Image).alloc_array = 1;
          temp = 0;
          align = 0;
          row_order = 0;
          ptr._6_1_ = 0;
          dataSize = 0;
          if (end_y < 0) {
            local_58 = Fl_Image::h((Fl_Image *)this);
            local_58 = local_58 + -1;
            offbits._4_4_ = -1;
          }
          else {
            local_58 = 0;
            offbits._4_4_ = Fl_Image::h((Fl_Image *)this);
          }
          for (repcount = local_58; repcount != offbits._4_4_; repcount = end_y + repcount) {
            puVar11 = (this->super_Fl_RGB_Image).array;
            iVar3 = Fl_Image::w((Fl_Image *)this);
            iVar4 = Fl_Image::d((Fl_Image *)this);
            colormap._760_8_ = puVar11 + repcount * iVar3 * iVar4;
            switch(compression) {
            case 1:
              color = Fl_Image::w((Fl_Image *)this);
              ptr._7_1_ = 0x80;
              for (; 0 < color; color = color + -1) {
                if (ptr._7_1_ == 0x80) {
                  iVar3 = getc(__stream);
                  ptr._6_1_ = (byte)iVar3;
                }
                if ((ptr._6_1_ & ptr._7_1_) == 0) {
                  *(undefined1 *)colormap._760_8_ = use_5_6_5._2_1_;
                  *(undefined1 *)(colormap._760_8_ + 1) = use_5_6_5._1_1_;
                  *(undefined1 *)(colormap._760_8_ + 2) = (undefined1)use_5_6_5;
                }
                else {
                  *(undefined1 *)colormap._760_8_ = local_373;
                  *(undefined1 *)(colormap._760_8_ + 1) = local_374;
                  *(undefined1 *)(colormap._760_8_ + 2) = use_5_6_5._3_1_;
                }
                colormap._760_8_ = colormap._760_8_ + 3;
                if (ptr._7_1_ < 2) {
                  ptr._7_1_ = 0x80;
                }
                else {
                  ptr._7_1_ = (byte)((int)(uint)ptr._7_1_ >> 1);
                }
              }
              iVar3 = Fl_Image::w((Fl_Image *)this);
              for (dataSize = (iVar3 + 7) / 8; (dataSize & 3U) != 0; dataSize = dataSize + 1) {
                getc(__stream);
              }
              break;
            case 4:
              color = Fl_Image::w((Fl_Image *)this);
              ptr._7_1_ = -0x10;
              for (; 0 < color; color = color + -1) {
                if (align == 0) {
                  if (x != 2) {
                    align = 2;
                    temp = -1;
                    goto LAB_002765e6;
                  }
                  while (0 < row_order) {
                    row_order = row_order + -1;
                    getc(__stream);
                  }
                  align = getc(__stream);
                  if (align != 0) {
                    temp = getc(__stream);
                    goto LAB_002765e6;
                  }
                  align = getc(__stream);
                  if (align != 0) {
                    if (align != 1) {
                      if (align == 2) {
                        iVar3 = getc(__stream);
                        iVar4 = getc(__stream);
                        iVar9 = Fl_Image::w((Fl_Image *)this);
                        align = iVar3 * iVar4 * iVar9;
                        temp = 0;
                      }
                      else {
                        temp = -1;
                        row_order = (int)(4 - (align & 3U)) / 2 & 1;
                      }
                      goto LAB_002765e6;
                    }
                    break;
                  }
                  color = color + 1;
                }
                else {
LAB_002765e6:
                  uVar1 = colormap._760_8_;
                  align = align + -1;
                  if (ptr._7_1_ == -0x10) {
                    if (temp < 0) {
                      dataSize = getc(__stream);
                    }
                    else {
                      dataSize = temp;
                    }
                    uVar1 = colormap._760_8_;
                    uVar5 = dataSize >> 4;
                    puVar12 = (undefined1 *)(colormap._760_8_ + 1);
                    colormap._760_8_ = puVar12;
                    *(undefined1 *)uVar1 =
                         *(undefined1 *)((long)&use_5_6_5 + (long)(int)(uVar5 & 0xf) * 3 + 2);
                    colormap._760_8_ = (undefined1 *)(uVar1 + 2);
                    *puVar12 = *(undefined1 *)((long)&use_5_6_5 + (long)(int)(uVar5 & 0xf) * 3 + 1);
                    colormap._760_8_ = uVar1 + 3;
                    *(undefined1 *)(uVar1 + 2) =
                         *(undefined1 *)((long)&use_5_6_5 + (long)(int)(uVar5 & 0xf) * 3);
                    ptr._7_1_ = '\x0f';
                  }
                  else {
                    ptr._7_1_ = -0x10;
                    puVar12 = (undefined1 *)(colormap._760_8_ + 1);
                    colormap._760_8_ = puVar12;
                    *(undefined1 *)uVar1 =
                         *(undefined1 *)((long)&use_5_6_5 + (long)(int)(dataSize & 0xf) * 3 + 2);
                    colormap._760_8_ = (undefined1 *)(uVar1 + 2);
                    *puVar12 = *(undefined1 *)
                                ((long)&use_5_6_5 + (long)(int)(dataSize & 0xf) * 3 + 1);
                    colormap._760_8_ = uVar1 + 3;
                    *(undefined1 *)(uVar1 + 2) =
                         *(undefined1 *)((long)&use_5_6_5 + (long)(int)(dataSize & 0xf) * 3);
                  }
                }
              }
              if (x == 0) {
                iVar3 = Fl_Image::w((Fl_Image *)this);
                for (dataSize = (iVar3 + 1) / 2; (dataSize & 3U) != 0; dataSize = dataSize + 1) {
                  getc(__stream);
                }
              }
              break;
            case 8:
              for (color = Fl_Image::w((Fl_Image *)this); 0 < color; color = color + -1) {
                if (x != 1) {
                  align = 1;
                  temp = -1;
                }
                if (align == 0) {
                  while (0 < row_order) {
                    row_order = row_order + -1;
                    getc(__stream);
                  }
                  align = getc(__stream);
                  if (align != 0) {
                    temp = getc(__stream);
                    goto LAB_00276909;
                  }
                  align = getc(__stream);
                  if (align != 0) {
                    if (align != 1) {
                      if (align == 2) {
                        iVar3 = getc(__stream);
                        iVar4 = getc(__stream);
                        iVar9 = Fl_Image::w((Fl_Image *)this);
                        align = iVar3 * iVar4 * iVar9;
                        temp = 0;
                      }
                      else {
                        temp = -1;
                        row_order = 2 - (align & 1U) & 1;
                      }
                      goto LAB_00276909;
                    }
                    break;
                  }
                  color = color + 1;
                }
                else {
LAB_00276909:
                  if (temp < 0) {
                    dataSize = getc(__stream);
                  }
                  else {
                    dataSize = temp;
                  }
                  uVar1 = colormap._760_8_;
                  align = align + -1;
                  puVar12 = (undefined1 *)(colormap._760_8_ + 1);
                  colormap._760_8_ = puVar12;
                  *(undefined1 *)uVar1 = *(undefined1 *)((long)&use_5_6_5 + (long)dataSize * 3 + 2);
                  colormap._760_8_ = (undefined1 *)(uVar1 + 2);
                  *puVar12 = *(undefined1 *)((long)&use_5_6_5 + (long)dataSize * 3 + 1);
                  colormap._760_8_ = uVar1 + 3;
                  *(undefined1 *)(uVar1 + 2) =
                       *(undefined1 *)((long)&use_5_6_5 + (long)dataSize * 3);
                  if (bVar13) {
                    colormap._760_8_ = uVar1 + 4;
                  }
                }
              }
              if (x == 0) {
                for (dataSize = Fl_Image::w((Fl_Image *)this); (dataSize & 3U) != 0;
                    dataSize = dataSize + 1) {
                  getc(__stream);
                }
              }
              break;
            case 0x10:
              for (color = Fl_Image::w((Fl_Image *)this); 0 < color; color = color + -1) {
                uVar5 = getc(__stream);
                uVar6 = getc(__stream);
                if (bVar14) {
                  *(char *)(colormap._760_8_ + 2) = (char)uVar5 << 3;
                  *(byte *)(colormap._760_8_ + 1) =
                       (byte)((uVar6 & 7) << 5) | (byte)((int)(uVar5 & 0xff) >> 3) & 0x1c;
                  *(byte *)colormap._760_8_ = (byte)uVar6 & 0xf8;
                }
                else {
                  *(char *)(colormap._760_8_ + 2) = (char)uVar5 << 3;
                  *(byte *)(colormap._760_8_ + 1) =
                       (byte)((uVar6 & 3) << 6) | (byte)((int)(uVar5 & 0xff) >> 2) & 0x38;
                  *(byte *)colormap._760_8_ = ((byte)uVar6 & 0x7c) << 1;
                }
                colormap._760_8_ = colormap._760_8_ + (long)colors_used;
              }
              iVar3 = Fl_Image::w((Fl_Image *)this);
              for (dataSize = iVar3 << 1; (dataSize & 3U) != 0; dataSize = dataSize + 1) {
                getc(__stream);
              }
              break;
            case 0x18:
              for (color = Fl_Image::w((Fl_Image *)this); 0 < color; color = color + -1) {
                iVar3 = getc(__stream);
                *(char *)(colormap._760_8_ + 2) = (char)iVar3;
                iVar3 = getc(__stream);
                *(char *)(colormap._760_8_ + 1) = (char)iVar3;
                iVar3 = getc(__stream);
                *(char *)colormap._760_8_ = (char)iVar3;
                colormap._760_8_ = colormap._760_8_ + (long)colors_used;
              }
              iVar3 = Fl_Image::w((Fl_Image *)this);
              for (dataSize = iVar3 * 3; (dataSize & 3U) != 0; dataSize = dataSize + 1) {
                getc(__stream);
              }
              break;
            case 0x20:
              for (color = Fl_Image::w((Fl_Image *)this); 0 < color; color = color + -1) {
                iVar3 = getc(__stream);
                *(char *)(colormap._760_8_ + 2) = (char)iVar3;
                iVar3 = getc(__stream);
                *(char *)(colormap._760_8_ + 1) = (char)iVar3;
                iVar3 = getc(__stream);
                *(char *)colormap._760_8_ = (char)iVar3;
                iVar3 = getc(__stream);
                *(char *)(colormap._760_8_ + 3) = (char)iVar3;
                colormap._760_8_ = colormap._760_8_ + (long)colors_used;
              }
            }
          }
          if (bVar13) {
            repcount = Fl_Image::h((Fl_Image *)this);
            while (repcount = repcount + -1, -1 < repcount) {
              puVar11 = (this->super_Fl_RGB_Image).array;
              iVar3 = Fl_Image::w((Fl_Image *)this);
              iVar4 = Fl_Image::d((Fl_Image *)this);
              colormap._760_8_ = puVar11 + (long)(repcount * iVar3 * iVar4) + 3;
              color = Fl_Image::w((Fl_Image *)this);
              ptr._7_1_ = 0x80;
              for (; 0 < color; color = color + -1) {
                if (ptr._7_1_ == 0x80) {
                  iVar3 = getc(__stream);
                  ptr._6_1_ = (byte)iVar3;
                }
                if ((ptr._6_1_ & ptr._7_1_) == 0) {
                  *(undefined1 *)colormap._760_8_ = 0xff;
                }
                else {
                  *(undefined1 *)colormap._760_8_ = 0;
                }
                if (ptr._7_1_ < 2) {
                  ptr._7_1_ = 0x80;
                }
                else {
                  ptr._7_1_ = (byte)((int)(uint)ptr._7_1_ >> 1);
                }
                colormap._760_8_ = colormap._760_8_ + (long)colors_used;
              }
              iVar3 = Fl_Image::w((Fl_Image *)this);
              for (dataSize = (iVar3 + 7) / 8; (dataSize & 3U) != 0; dataSize = dataSize + 1) {
                getc(__stream);
              }
            }
          }
          fclose(__stream);
        }
      }
    }
    else {
      fclose(__stream);
      Fl_Image::ld((Fl_Image *)this,-3);
    }
  }
  return;
}

Assistant:

Fl_BMP_Image::Fl_BMP_Image(const char *bmp) // I - File to read
  : Fl_RGB_Image(0,0,0) {
  FILE		*fp;		// File pointer
  int		info_size,	// Size of info header
		depth,		// Depth of image (bits)
		bDepth = 3,	// Depth of image (bytes)
		compression,	// Type of compression
		colors_used,	// Number of colors used
		x, y,		// Looping vars
		color,		// Color of RLE pixel
		repcount,	// Number of times to repeat
		temp,		// Temporary color
		align,		// Alignment bytes
		dataSize,	// number of bytes in image data set
		row_order,	// 1 = normal;  -1 = flipped row order
		start_y,	// Beginning Y
		end_y;		// Ending Y
  long		offbits;	// Offset to image data
  uchar		bit,		// Bit in image
		byte;		// Byte in image
  uchar		*ptr;		// Pointer into pixels
  uchar		colormap[256][3];// Colormap
  uchar		havemask;	// Single bit mask follows image data
  int		use_5_6_5;	// Use 5:6:5 for R:G:B channels in 16 bit images


  // Open the file...
  if ((fp = fl_fopen(bmp, "rb")) == NULL) {
    ld(ERR_FILE_ACCESS);
    return;
  }

  // Get the header...
  byte = (uchar)getc(fp);	// Check "BM" sync chars
  bit  = (uchar)getc(fp);
  if (byte != 'B' || bit != 'M') {
    fclose(fp);
    ld(ERR_FORMAT);
    return;
  }

  read_dword(fp);		// Skip size
  read_word(fp);		// Skip reserved stuff
  read_word(fp);
  offbits = (long)read_dword(fp);// Read offset to image data

  // Then the bitmap information...
  info_size = read_dword(fp);

//  printf("offbits = %ld, info_size = %d\n", offbits, info_size);

  havemask  = 0;
  row_order = -1;
  use_5_6_5 = 0;

  if (info_size < 40) {
    // Old Windows/OS2 BMP header...
    w(read_word(fp));
    h(read_word(fp));
    read_word(fp);
    depth = read_word(fp);
    compression = BI_RGB;
    colors_used = 0;

    repcount = info_size - 12;
  } else {
    // New BMP header...
    w(read_long(fp));
    // If the height is negative, the row order is flipped
    temp = read_long(fp);
    if (temp < 0) row_order = 1;
    h(abs(temp));
    read_word(fp);
    depth = read_word(fp);
    compression = read_dword(fp);
    dataSize = read_dword(fp);
    read_long(fp);
    read_long(fp);
    colors_used = read_dword(fp);
    read_dword(fp);

    repcount = info_size - 40;

    if (!compression && depth>=8 && w()>32/depth) {
      int Bpp = depth/8;
      int maskSize = (((w()*Bpp+3)&~3)*h()) + (((((w()+7)/8)+3)&~3)*h());
      if (maskSize==2*dataSize) {
        havemask = 1;
	h(h()/2);
	bDepth = 4;
      }
    }
  }

//  printf("w() = %d, h() = %d, depth = %d, compression = %d, colors_used = %d, repcount = %d\n",
//         w(), h(), depth, compression, colors_used, repcount);

  // Skip remaining header bytes...
  while (repcount > 0) {
    getc(fp);
    repcount --;
  }

  // Check header data...
  if (!w() || !h() || !depth) {
    fclose(fp);
    w(0); h(0); d(0); ld(ERR_FORMAT);
    return;
  }

  // Get colormap...
  if (colors_used == 0 && depth <= 8)
    colors_used = 1 << depth;

  for (repcount = 0; repcount < colors_used; repcount ++) {
    // Read BGR color...
    if (fread(colormap[repcount], 1, 3, fp)==0) { /* ignore */ }

    // Skip pad byte for new BMP files...
    if (info_size > 12) getc(fp);
  }

  // Read first dword of colormap. It tells us if 5:5:5 or 5:6:5 for 16 bit
  if (depth == 16)
    use_5_6_5 = (read_dword(fp) == 0xf800);

  // Set byte depth for RGBA images
  if (depth == 32)
    bDepth=4;

  // Setup image and buffers...
  d(bDepth);
  if (offbits) fseek(fp, offbits, SEEK_SET);

  if (((size_t)w()) * h() * d() > max_size() ) {
    Fl::warning("BMP file \"%s\" is too large!\n", bmp);
    fclose(fp);
    w(0); h(0); d(0); ld(ERR_FORMAT);
    return;
  }
  array = new uchar[w() * h() * d()];
  alloc_array = 1;

  // Read the image data...
  color = 0;
  repcount = 0;
  align = 0;
  byte  = 0;
  temp  = 0;

  if (row_order < 0) {
    start_y = h() - 1;
    end_y   = -1;
  } else {
    start_y = 0;
    end_y   = h();
  }

  for (y = start_y; y != end_y; y += row_order) {
    ptr = (uchar *)array + y * w() * d();

    switch (depth)
    {
      case 1 : // Bitmap
          for (x = w(), bit = 128; x > 0; x --) {
	    if (bit == 128) byte = (uchar)getc(fp);

	    if (byte & bit) {
	      *ptr++ = colormap[1][2];
	      *ptr++ = colormap[1][1];
	      *ptr++ = colormap[1][0];
	    } else {
	      *ptr++ = colormap[0][2];
	      *ptr++ = colormap[0][1];
	      *ptr++ = colormap[0][0];
	    }

	    if (bit > 1)
	      bit >>= 1;
	    else
	      bit = 128;
	  }

          // Read remaining bytes to align to 32 bits...
	  for (temp = (w() + 7) / 8; temp & 3; temp ++) {
	    getc(fp);
	  }
          break;

      case 4 : // 16-color
          for (x = w(), bit = 0xf0; x > 0; x --) {
	    // Get a new repcount as needed...
	    if (repcount == 0) {
              if (compression != BI_RLE4) {
		repcount = 2;
		color = -1;
              } else {
		while (align > 0) {
	          align --;
		  getc(fp);
        	}

		if ((repcount = getc(fp)) == 0) {
		  if ((repcount = getc(fp)) == 0) {
		    // End of line...
                    x ++;
		    continue;
		  } else if (repcount == 1) {
                    // End of image...
		    break;
		  } else if (repcount == 2) {
		    // Delta...
		    repcount = getc(fp) * getc(fp) * w();
		    color = 0;
		  } else {
		    // Absolute...
		    color = -1;
		    align = ((4 - (repcount & 3)) / 2) & 1;
		  }
		} else {
	          color = getc(fp);
		}
	      }
	    }

            // Get a new color as needed...
	    repcount --;

	    // Extract the next pixel...
            if (bit == 0xf0) {
	      // Get the next color byte as needed...
              if (color < 0) temp = getc(fp);
	      else temp = color;

              // Copy the color value...
	      *ptr++ = colormap[(temp >> 4) & 15][2];
	      *ptr++ = colormap[(temp >> 4) & 15][1];
	      *ptr++ = colormap[(temp >> 4) & 15][0];

	      bit  = 0x0f;
	    } else {
	      bit  = 0xf0;

              // Copy the color value...
	      *ptr++ = colormap[temp & 15][2];
	      *ptr++ = colormap[temp & 15][1];
	      *ptr++ = colormap[temp & 15][0];
	    }

	  }

	  if (!compression) {
            // Read remaining bytes to align to 32 bits...
	    for (temp = (w() + 1) / 2; temp & 3; temp ++) {
	      getc(fp);
	    }
	  }
          break;

      case 8 : // 256-color
          for (x = w(); x > 0; x --) {
	    // Get a new repcount as needed...
            if (compression != BI_RLE8) {
	      repcount = 1;
	      color = -1;
            }

	    if (repcount == 0) {
	      while (align > 0) {
	        align --;
		getc(fp);
              }

	      if ((repcount = getc(fp)) == 0) {
		if ((repcount = getc(fp)) == 0) {
		  // End of line...
                  x ++;
		  continue;
		} else if (repcount == 1) {
		  // End of image...
		  break;
		} else if (repcount == 2) {
		  // Delta...
		  repcount = getc(fp) * getc(fp) * w();
		  color = 0;
		} else {
		  // Absolute...
		  color = -1;
		  align = (2 - (repcount & 1)) & 1;
		}
	      } else {
	        color = getc(fp);
              }
            }

            // Get a new color as needed...
            if (color < 0) temp = getc(fp);
	    else temp = color;

            repcount --;

            // Copy the color value...
	    *ptr++ = colormap[temp][2];
	    *ptr++ = colormap[temp][1];
	    *ptr++ = colormap[temp][0];
	    if (havemask) ptr++;
	  }

	  if (!compression) {
            // Read remaining bytes to align to 32 bits...
	    for (temp = w(); temp & 3; temp ++) {
	      getc(fp);
	    }
	  }
          break;

      case 16 : // 16-bit 5:5:5 or 5:6:5 RGB
          for (x = w(); x > 0; x --, ptr += bDepth) {
	    uchar b = getc(fp), a = getc(fp) ;
	    if (use_5_6_5) {
		ptr[2] = (uchar)(( b << 3 ) & 0xf8);
		ptr[1] = (uchar)(((a << 5) & 0xe0) | ((b >> 3) & 0x1c));
		ptr[0] = (uchar)(a & 0xf8);
	    } else {
		ptr[2] = (uchar)((b << 3) & 0xf8);
		ptr[1] = (uchar)(((a << 6) & 0xc0) | ((b >> 2) & 0x38));
		ptr[0] = (uchar)((a<<1) & 0xf8);
	    }
	  }

          // Read remaining bytes to align to 32 bits...
	  for (temp = w() * 2; temp & 3; temp ++) {
	    getc(fp);
	  }
          break;

      case 24 : // 24-bit RGB
          for (x = w(); x > 0; x --, ptr += bDepth) {
	    ptr[2] = (uchar)getc(fp);
	    ptr[1] = (uchar)getc(fp);
	    ptr[0] = (uchar)getc(fp);
	  }

          // Read remaining bytes to align to 32 bits...
	  for (temp = w() * 3; temp & 3; temp ++) {
	    getc(fp);
	  }
          break;
		  
      case 32 : // 32-bit RGBA
         for (x = w(); x > 0; x --, ptr += bDepth) {
            ptr[2] = (uchar)getc(fp);
            ptr[1] = (uchar)getc(fp);
            ptr[0] = (uchar)getc(fp);
            ptr[3] = (uchar)getc(fp);
          }
          break;
    }
  }
  
  if (havemask) {
    for (y = h() - 1; y >= 0; y --) {
      ptr = (uchar *)array + y * w() * d() + 3;
      for (x = w(), bit = 128; x > 0; x --, ptr+=bDepth) {
	if (bit == 128) byte = (uchar)getc(fp);
	if (byte & bit)
	  *ptr = 0;
	else
	  *ptr = 255;
	if (bit > 1)
	  bit >>= 1;
	else
	  bit = 128;
      }
      // Read remaining bytes to align to 32 bits...
      for (temp = (w() + 7) / 8; temp & 3; temp ++)
	getc(fp);
    }
  }

  // Close the file and return...
  fclose(fp);
}